

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdLine.h
# Opt level: O0

void TCLAP::ClearContainer<std::__cxx11::list<TCLAP::Arg*,std::allocator<TCLAP::Arg*>>>
               (list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *c)

{
  iterator this;
  _List_iterator<TCLAP::Arg_*> in_RDI;
  _List_iterator<TCLAP::Arg_*> unaff_retaddr;
  list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *in_stack_ffffffffffffffe8;
  
  this = std::__cxx11::list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::begin
                   (in_stack_ffffffffffffffe8);
  std::__cxx11::list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::end(in_stack_ffffffffffffffe8);
  __std__for_each<std::_List_iterator<TCLAP::Arg*>,void(*)(TCLAP::Arg*)>_std___List_iterator<TCLAP::Arg*>_std___List_iterator<TCLAP::Arg*>_void____TCLAP__Arg____
            (unaff_retaddr,in_RDI,(_func_void_Arg_ptr *)this._M_node);
  std::__cxx11::list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::clear
            ((list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *)this._M_node);
  return;
}

Assistant:

void ClearContainer(C &c)
{
	typedef typename C::value_type value_type;
	std::for_each(c.begin(), c.end(), DelPtr<value_type>);
	c.clear();
}